

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O1

optional<metaf::TrendGroup> *
metaf::TrendGroup::fromFm(optional<metaf::TrendGroup> *__return_storage_ptr__,string *s)

{
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __s;
  void *pvVar1;
  bool bVar2;
  int iVar3;
  optional<metaf::MetafTime> time;
  string local_58;
  optional<metaf::MetafTime> local_34;
  
  if ((fromFm(std::__cxx11::string_const&)::rgx_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&fromFm(std::__cxx11::string_const&)::rgx_abi_cxx11_), iVar3 != 0)
     ) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&fromFm(std::__cxx11::string_const&)::rgx_abi_cxx11_,"FM\\d\\d\\d\\d\\d\\d",0x10);
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &fromFm(std::__cxx11::string_const&)::rgx_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&fromFm(std::__cxx11::string_const&)::rgx_abi_cxx11_);
  }
  __s._M_current = (s->_M_dataplus)._M_p;
  local_58.field_2._M_allocated_capacity = 0;
  local_58.field_2._8_8_ = 0;
  local_58._M_dataplus._M_p._0_4_ = 0;
  local_58._M_dataplus._M_p._4_4_ = 0;
  local_58._M_string_length._0_5_ = 0;
  local_58._M_string_length._5_2_ = 0;
  local_58._M_string_length._7_1_ = 0;
  bVar2 = std::__detail::
          __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                    (__s,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          )(__s._M_current + s->_M_string_length),
                     (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)&local_58,&fromFm(std::__cxx11::string_const&)::rgx_abi_cxx11_,0);
  pvVar1 = (void *)CONCAT44(local_58._M_dataplus._M_p._4_4_,local_58._M_dataplus._M_p._0_4_);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,local_58.field_2._M_allocated_capacity - (long)pvVar1);
  }
  if (bVar2) {
    std::__cxx11::string::substr((ulong)&local_58,(ulong)s);
    MetafTime::fromStringDDHHMM(&local_34,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_58._M_dataplus._M_p._4_4_,local_58._M_dataplus._M_p._0_4_) !=
        &local_58.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_58._M_dataplus._M_p._4_4_,local_58._M_dataplus._M_p._0_4_),
                      local_58.field_2._M_allocated_capacity + 1);
    }
    if (local_34.super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
        super__Optional_payload_base<metaf::MetafTime>._M_engaged != false) {
      local_58._M_string_length._0_5_ =
           local_34.super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
           super__Optional_payload_base<metaf::MetafTime>._M_payload._0_5_;
      local_58._M_string_length._5_2_ =
           local_34.super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
           super__Optional_payload_base<metaf::MetafTime>._M_payload._5_2_;
      local_58._M_string_length._7_1_ =
           local_34.super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
           super__Optional_payload_base<metaf::MetafTime>._M_payload._7_1_;
      *(undefined2 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x1d) =
           local_34.super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
           super__Optional_payload_base<metaf::MetafTime>._17_2_;
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x1f) =
           local_34.super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
           super__Optional_payload_base<metaf::MetafTime>._19_1_;
      (__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::TrendGroup>._M_payload._M_value.t = FROM;
      (__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::TrendGroup>._M_payload._M_value.prob = NONE;
      (__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::TrendGroup>._M_payload._M_value.isTafTimeSpanGroup = false
      ;
      *(ulong *)((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>
                        )._M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 9)
           = CONCAT53((undefined5)local_58._M_string_length,local_58._M_dataplus._M_p._5_3_);
      *(undefined2 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x11) =
           local_58._M_string_length._5_2_;
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x13) =
           local_58._M_string_length._7_1_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x14) =
           local_34.super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
           super__Optional_payload_base<metaf::MetafTime>._M_payload._8_8_;
      *(bool *)((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)
                       ._M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x1c
               ) = local_34.super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
                   super__Optional_payload_base<metaf::MetafTime>._M_engaged;
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x30) = 0;
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x44) = 0;
      (__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::TrendGroup>._M_engaged = true;
      return __return_storage_ptr__;
    }
  }
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x3c) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x44) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x30) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x38) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x20) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x28) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x10) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x18) = 0;
  *(undefined8 *)
   &(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
    super__Optional_payload_base<metaf::TrendGroup>._M_payload = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::TrendGroup>._M_payload + 8) = 0;
  return __return_storage_ptr__;
}

Assistant:

std::optional<TrendGroup> TrendGroup::fromFm(const std::string & s) {
	static const std::optional<TrendGroup> notRecognised;
	static const std::regex rgx("FM\\d\\d\\d\\d\\d\\d");
	static const auto posTime = 2, lenTime = 6;
	if (!regex_match(s, rgx)) return notRecognised;
	const auto time = MetafTime::fromStringDDHHMM(s.substr(posTime, lenTime));
	if (!time.has_value()) return notRecognised;

	TrendGroup result;
	result.t = Type::FROM;
	result.tFrom = time;
	return result;
}